

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArray<float,_false,_false>::DirectGetItem
          (TypedArray<float,_false,_false> *this,uint32 index)

{
  Var pvVar1;
  
  pvVar1 = TypedDirectGetItemWithCheck(this,index);
  return pvVar1;
}

Assistant:

Var Float32Array::DirectGetItem(__in uint32 index)
    {
        return TypedDirectGetItemWithCheck(index);
    }